

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLboolean hasUsableInputMethodStyle(void)

{
  long lVar1;
  ushort *local_20;
  XIMStyles *styles;
  uint local_10;
  GLboolean found;
  uint i;
  
  styles._7_1_ = '\0';
  local_20 = (ushort *)0x0;
  lVar1 = XGetIMValues(_glfw.x11.im,"queryInputStyle",&local_20,0);
  if (lVar1 == 0) {
    for (local_10 = 0; local_10 < *local_20; local_10 = local_10 + 1) {
      if (*(long *)(*(long *)(local_20 + 4) + (ulong)local_10 * 8) == 0x408) {
        styles._7_1_ = '\x01';
        break;
      }
    }
    XFree(local_20);
    found = styles._7_1_;
  }
  else {
    found = '\0';
  }
  return found;
}

Assistant:

static GLboolean hasUsableInputMethodStyle(void)
{
    unsigned int i;
    GLboolean found = GL_FALSE;
    XIMStyles* styles = NULL;

    if (XGetIMValues(_glfw.x11.im, XNQueryInputStyle, &styles, NULL) != NULL)
        return GL_FALSE;

    for (i = 0;  i < styles->count_styles;  i++)
    {
        if (styles->supported_styles[i] == (XIMPreeditNothing | XIMStatusNothing))
        {
            found = GL_TRUE;
            break;
        }
    }

    XFree(styles);
    return found;
}